

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MultiDispatchReuseCommandCase::
~MultiDispatchReuseCommandCase(MultiDispatchReuseCommandCase *this)

{
  IndirectDispatchCase::~IndirectDispatchCase(&this->super_IndirectDispatchCase);
  operator_delete(this,0xb0);
  return;
}

Assistant:

MultiDispatchReuseCommandCase (Context& context, GenBuffer genBuffer)
		: IndirectDispatchCase(context, "multi_dispatch_reuse_command", "Dispatch multiple compute commands from single buffer", genBuffer)
	{
		m_bufferSize	= 1<<10;
		m_workGroupSize	= UVec3(3,1,2);

		m_commands.push_back(DispatchCommand(0,						UVec3(1,1,1)));
		m_commands.push_back(DispatchCommand(0,						UVec3(1,1,1)));
		m_commands.push_back(DispatchCommand(0,						UVec3(1,1,1)));
		m_commands.push_back(DispatchCommand(104,					UVec3(1,3,1)));
		m_commands.push_back(DispatchCommand(104,					UVec3(1,3,1)));
		m_commands.push_back(DispatchCommand(52,					UVec3(1,1,4)));
		m_commands.push_back(DispatchCommand(52,					UVec3(1,1,4)));
	}